

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O3

void __thiscall
ConsistencyChecker::printOpError
          (ConsistencyChecker *this,OpTpl *op,Constructor *ct,int4 err1,int4 err2,string *msg)

{
  long lVar1;
  SleighCompile *this_00;
  OpTpl *pOVar2;
  ostream *poVar3;
  ConsistencyChecker *pCVar4;
  mapped_type *loc;
  long lVar5;
  char *pcVar6;
  long lVar7;
  ostringstream msgBuilder;
  undefined1 local_1c8 [32];
  ConsistencyChecker local_1a8;
  ios_base local_138 [264];
  
  pOVar2 = op;
  if (err1 != -1) {
    pOVar2 = (OpTpl *)((op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + err1);
  }
  if (*(int *)(pOVar2->output + 0x40) == 1) {
    lVar5 = *(long *)(*(long *)(ct + 0x18) + (long)*(int *)(pOVar2->output + 0x48) * 8);
  }
  else {
    lVar5 = 0;
  }
  if (err2 == err1) {
LAB_0010ccba:
    lVar7 = 0;
  }
  else {
    pOVar2 = op;
    if (err2 != -1) {
      pOVar2 = (OpTpl *)((op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + err2);
    }
    if (*(int *)(pOVar2->output + 0x40) != 1) goto LAB_0010ccba;
    lVar7 = *(long *)(*(long *)(ct + 0x18) + (long)*(int *)(pOVar2->output + 0x48) * 8);
  }
  lVar1 = *(long *)(ct + 8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Size restriction error in table \'",0x21);
  pCVar4 = &local_1a8;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pCVar4,*(char **)(lVar1 + 8),*(long *)(lVar1 + 0x10));
  pcVar6 = "\'";
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((lVar5 == 0) || (lVar7 == 0)) {
    if (lVar5 == 0) {
      if (lVar7 == 0) {
        lVar5 = 9;
        pcVar6 = "  Problem";
        goto LAB_0010cde5;
      }
      pCVar4 = &local_1a8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pCVar4,"  Problem with operand 2 \'",0x1a);
    }
    else {
      pCVar4 = &local_1a8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pCVar4,"  Problem with operand 1 \'",0x1a);
      lVar7 = lVar5;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  Problem with operands \'",0x19);
    pCVar4 = (ConsistencyChecker *)
             std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,*(char **)(lVar5 + 8),*(long *)(lVar5 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pCVar4,"\' and \'",7);
  }
  pCVar4 = (ConsistencyChecker *)
           std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pCVar4,*(char **)(lVar7 + 8),*(long *)(lVar7 + 0x10));
  lVar5 = 1;
LAB_0010cde5:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pCVar4,pcVar6,lVar5);
  pCVar4 = &local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pCVar4," in ",4);
  printOpName(pCVar4,(ostream *)&local_1a8,op);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," operator",9);
  std::ios::widen((char)&local_1a8 +
                  (char)*(undefined8 *)
                         ((long)&local_1a8.compiler[-1].currentLocCache.filename.field_2 + 8));
  std::ostream::put((char)&local_1a8);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  this_00 = this->compiler;
  local_1c8._0_8_ = ct;
  loc = std::
        map<Constructor_*,_Location,_std::less<Constructor_*>,_std::allocator<std::pair<Constructor_*const,_Location>_>_>
        ::at(&this_00->ctorLocationMap,(key_type *)local_1c8);
  std::__cxx11::stringbuf::str();
  SleighCompile::reportError(this_00,loc,(string *)local_1c8);
  if ((Constructor *)local_1c8._0_8_ != (Constructor *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ConsistencyChecker::printOpError(OpTpl *op,Constructor *ct,int4 err1,int4 err2,const string &msg)

{
  SubtableSymbol *sym = ct->getParent();
  OperandSymbol *op1,*op2;

  op1 = getOperandSymbol(err1,op,ct);
  if (err2 != err1)
    op2 = getOperandSymbol(err2,op,ct);
  else
    op2 = (OperandSymbol *)0;

  ostringstream msgBuilder;

  msgBuilder << "Size restriction error in table '" << sym->getName() << "'" << endl;
  if ((op1 != (OperandSymbol *)0)&&(op2 != (OperandSymbol *)0))
    msgBuilder << "  Problem with operands '" << op1->getName() << "' and '" << op2->getName() << "'";
  else if (op1 != (OperandSymbol *)0)
    msgBuilder << "  Problem with operand 1 '" << op1->getName() << "'";
  else if (op2 != (OperandSymbol *)0)
    msgBuilder << "  Problem with operand 2 '" << op2->getName() << "'";
  else
    msgBuilder << "  Problem";
  msgBuilder << " in ";
  printOpName(msgBuilder,op);
  msgBuilder << " operator" << endl << "  " << msg;

  compiler->reportError(compiler->getLocation(ct), msgBuilder.str());
}